

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall
ADPlanner::UpdatePredsofUnderconsState
          (ADPlanner *this,ADState *state,ADSearchStateSpace_t *pSearchStateSpace)

{
  pointer piVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  CMDPSTATE *PredMDPState;
  int pind;
  ADState *predstate;
  CKey key;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> PredIDV;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  int local_74;
  CKey local_58;
  undefined1 local_48 [24];
  vector<int,_std::allocator<int>_> local_30;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1924b6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1924c0);
  CKey::CKey(&local_58);
  (**(code **)(*(long *)in_RDI[1] + 0x58))
            ((long *)in_RDI[1],**(undefined4 **)(local_10 + 0x18),&local_30,local_48);
  local_74 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_30);
    if ((int)sVar2 <= local_74) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_74);
    in_stack_ffffffffffffff80 =
         (vector<int,_std::allocator<int>_> *)(**(code **)(*in_RDI + 200))(in_RDI,*pvVar3,local_18);
    piVar1 = in_stack_ffffffffffffff80[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (*(short *)((long)piVar1 + 0x2a) != *(short *)(local_18 + 0x22)) {
      (**(code **)(*in_RDI + 0xe0))(in_RDI,piVar1,local_18);
    }
    if (*(long *)(piVar1 + 0xe) == *(long *)(local_10 + 0x18)) {
      (**(code **)(*in_RDI + 0x118))(in_RDI,piVar1);
      (**(code **)(*in_RDI + 0x110))(in_RDI,piVar1);
    }
    local_74 = local_74 + 1;
  }
  CKey::~CKey(&local_58);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff80);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void ADPlanner::UpdatePredsofUnderconsState(ADState* state, ADSearchStateSpace_t* pSearchStateSpace)
{
    vector<int> PredIDV;
    vector<int> CostV;
    CKey key;
    ADState *predstate;

    environment_->GetPreds(state->MDPstate->StateID, &PredIDV, &CostV);

    //iterate through predecessors of s
    for (int pind = 0; pind < (int)PredIDV.size(); pind++) {

        CMDPSTATE* PredMDPState = GetState(PredIDV[pind], pSearchStateSpace);
        predstate = (ADState*)(PredMDPState->PlannerSpecificData);
        if (predstate->callnumberaccessed != pSearchStateSpace->callnumber) {
            ReInitializeSearchStateInfo(predstate, pSearchStateSpace);
        }

        if (predstate->bestnextstate == state->MDPstate) {
            Recomputegval(predstate);
            UpdateSetMembership(predstate);

#if DEBUG
            if(predstate->MDPstate->StateID == 679256)
            {
                SBPL_FPRINTF(fDeb, "updated pred %d of undercons exp\n", predstate->MDPstate->StateID);
                PrintSearchState(predstate, fDeb);
                SBPL_FPRINTF(fDeb, "\n");
            }
#endif
        }
    } //for predecessors
}